

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_update_fprs_dirty(DisasContext_conflict8 *dc,int rd)

{
  TCGContext_conflict8 *tcg_ctx;
  TCGv_i32 ret;
  uint arg2;
  
  arg2 = (0x1f < rd) + 1;
  if ((dc->fprs_dirty & arg2) != 0) {
    return;
  }
  tcg_ctx = dc->uc->tcg_ctx;
  dc->fprs_dirty = dc->fprs_dirty | arg2;
  ret = tcg_ctx->cpu_fprs;
  tcg_gen_ori_i32_sparc64(tcg_ctx,ret,ret,arg2);
  return;
}

Assistant:

static inline void gen_update_fprs_dirty(DisasContext *dc, int rd)
{
#if defined(TARGET_SPARC64)
    int bit = (rd < 32) ? 1 : 2;
    TCGContext *tcg_ctx = dc->uc->tcg_ctx;
    /* If we know we've already set this bit within the TB,
       we can avoid setting it again.  */
    if (!(dc->fprs_dirty & bit)) {
        dc->fprs_dirty |= bit;
        tcg_gen_ori_i32(tcg_ctx, tcg_ctx->cpu_fprs, tcg_ctx->cpu_fprs, bit);
    }
#endif
}